

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall MakefileGenerator::initCompiler(MakefileGenerator *this,Compiler *comp)

{
  byte bVar1;
  _List_node_base *p_Var2;
  Data<QHashPrivate::Node<QString,_bool>_> *this_00;
  ProStringList l;
  Data *pDVar3;
  ProString *pPVar4;
  qsizetype qVar5;
  ProStringList *pPVar6;
  Node<QString,_bool> *pNVar7;
  long in_FS_OFFSET;
  char *pcVar8;
  QArrayData *in_stack_ffffffffffffff48;
  QArrayDataPointer<ProString> local_a0;
  QArrayDataPointer<ProString> local_88;
  ProKey local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = (this->project->super_QMakeEvaluator).m_valuemapStack.
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  ProKey::ProKey(&local_68,&comp->variable_in);
  pPVar6 = QMap<ProKey,_ProStringList>::operator[]
                     ((QMap<ProKey,_ProStringList> *)(p_Var2 + 1),&local_68);
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = (this->init_compiler_already).d;
  if (this_00 != (Data<QHashPrivate::Node<QString,_bool>_> *)0x0) {
    pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QString,_bool>_>::findNode<QString>
                       (this_00,&comp->variable_in);
    if (pNVar7 != (Node<QString,_bool> *)0x0) goto LAB_0015a94d;
  }
  local_68.super_ProString.m_string.d.d =
       (Data *)CONCAT71(local_68.super_ProString.m_string.d.d._1_7_,1);
  QHash<QString,bool>::emplace<bool_const&>
            ((QHash<QString,bool> *)&this->init_compiler_already,&comp->variable_in,
             (bool *)&local_68);
  if (this->no_io == false) {
    bVar1 = (byte)comp->flags;
    local_a0.d = (pPVar6->super_QList<ProString>).d.d;
    local_a0.ptr = (pPVar6->super_QList<ProString>).d.ptr;
    local_a0.size = (pPVar6->super_QList<ProString>).d.size;
    if (local_a0.d != (Data *)0x0) {
      LOCK();
      ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pcVar8 = "VPATH_";
    QStringBuilder<const_char_(&)[7],_const_QString_&>::convertTo<QString>
              ((QString *)&stack0xffffffffffffff48,
               (QStringBuilder<const_char_(&)[7],_const_QString_&> *)&stack0xffffffffffffff38);
    l.super_QList<ProString>.d.ptr = (ProString *)comp;
    l.super_QList<ProString>.d.d = (Data *)pcVar8;
    l.super_QList<ProString>.d.size = (qsizetype)in_stack_ffffffffffffff48;
    findFilesInVPATH((ProStringList *)&local_88,this,l,(uchar)&local_a0,
                     (QString *)(ulong)(bVar1 >> 3 & 1 | bVar1 >> 1 & 2));
    qVar5 = local_88.size;
    pPVar4 = local_88.ptr;
    pDVar3 = local_88.d;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (ProString *)0x0;
    local_68.super_ProString.m_string.d.d = (Data *)(pPVar6->super_QList<ProString>).d.d;
    local_68.super_ProString.m_string.d.ptr = (char16_t *)(pPVar6->super_QList<ProString>).d.ptr;
    (pPVar6->super_QList<ProString>).d.d = pDVar3;
    (pPVar6->super_QList<ProString>).d.ptr = pPVar4;
    local_68.super_ProString.m_string.d.size = (pPVar6->super_QList<ProString>).d.size;
    (pPVar6->super_QList<ProString>).d.size = qVar5;
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_68);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
    if (in_stack_ffffffffffffff48 != (QArrayData *)0x0) {
      LOCK();
      (in_stack_ffffffffffffff48->ref_)._q_value.super___atomic_base<int>._M_i =
           (in_stack_ffffffffffffff48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((in_stack_ffffffffffffff48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(in_stack_ffffffffffffff48,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_a0);
  }
LAB_0015a94d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::initCompiler(const MakefileGenerator::Compiler &comp)
{
    ProValueMap &v = project->variables();
    ProStringList &l = v[ProKey(comp.variable_in)];
    // find all the relevant file inputs
    if(!init_compiler_already.contains(comp.variable_in)) {
        init_compiler_already.insert(comp.variable_in, true);
        if(!noIO()) {
            uchar flags = 0;
            if (comp.flags & Compiler::CompilerRemoveNoExist)
                flags |= VPATH_RemoveMissingFiles;
            if (comp.flags & Compiler::CompilerWarnNoExist)
                flags |= VPATH_WarnMissingFiles;
            l = findFilesInVPATH(l, flags, "VPATH_" + comp.variable_in);
        }
    }
}